

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool __thiscall AActor::UpdateWaterLevel(AActor *this,bool dosplash)

{
  double dVar1;
  double dVar2;
  extsector_t *peVar3;
  long *plVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  sector_t_conflict *psVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  DVector3 local_38;
  
  iVar8 = this->waterlevel;
  this->waterlevel = 0;
  psVar9 = (sector_t_conflict *)this->Sector;
  if (psVar9 == (sector_t_conflict *)0x0) {
    return false;
  }
  if ((psVar9->MoreFlags & 0x20) != 0) {
    this->waterlevel = 3;
    local_38.Z = -3.4028234663852886e+38;
LAB_00426fb7:
    bVar13 = false;
    goto LAB_004270d8;
  }
  psVar9 = sector_t::GetHeightSec(psVar9);
  if (psVar9 == (sector_t_conflict *)0x0) {
    peVar3 = this->Sector->e;
    uVar10 = (ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar10 != 0) {
      dVar6 = (this->__Pos).X;
      dVar7 = (this->__Pos).Y;
      dVar1 = (this->__Pos).Z;
      dVar2 = this->Height;
      dVar14 = dVar2 * 0.5 + dVar1;
      lVar12 = 0;
      do {
        plVar4 = *(long **)((long)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                  Array + lVar12);
        if ((*(uint *)(plVar4 + 0xb) & 0x13) == 0x11) {
          pdVar5 = (double *)plVar4[5];
          local_38.Z = (pdVar5[1] * dVar7 + pdVar5[3] + *pdVar5 * dVar6) * pdVar5[4];
          if ((dVar1 < local_38.Z) &&
             (pdVar5 = (double *)*plVar4,
             (pdVar5[1] * dVar7 + pdVar5[3] + *pdVar5 * dVar6) * pdVar5[4] <= dVar14)) {
            if ((local_38.Z <= dVar1) || (this->waterlevel = 1, local_38.Z <= dVar14))
            goto LAB_00426fb7;
            this->waterlevel = 2;
            if (this->player == (player_t *)0x0) {
LAB_004271ab:
              if (local_38.Z < dVar1 + dVar2) goto LAB_00426fb7;
            }
            else if (local_38.Z < dVar2 + dVar1) {
              dVar2 = this->player->viewheight;
              goto LAB_004271ab;
            }
            this->waterlevel = 3;
            goto LAB_00426fb7;
          }
        }
        lVar12 = lVar12 + 8;
      } while (uVar10 << 3 != lVar12);
    }
    bVar13 = false;
    local_38.Z = -3.4028234663852886e+38;
    goto LAB_004270d8;
  }
  dVar2 = (this->__Pos).X;
  dVar6 = (this->__Pos).Y;
  local_38.Z = ((psVar9->floorplane).normal.Y * dVar6 +
               (psVar9->floorplane).D + (psVar9->floorplane).normal.X * dVar2) *
               (psVar9->floorplane).negiC;
  dVar1 = (this->__Pos).Z;
  if (local_38.Z <= dVar1) {
    if (((psVar9->MoreFlags & 2) != 0) ||
       (iVar11 = 3,
       dVar1 + this->Height <=
       (dVar6 * (psVar9->ceilingplane).normal.Y +
       (psVar9->ceilingplane).D + dVar2 * (psVar9->ceilingplane).normal.X) *
       (psVar9->ceilingplane).negiC)) {
      iVar11 = 0;
    }
LAB_004270c7:
    this->waterlevel = iVar11;
  }
  else {
    this->waterlevel = 1;
    dVar2 = this->Height;
    if (dVar2 * 0.5 + dVar1 < local_38.Z) {
      this->waterlevel = 2;
      if (this->player != (player_t *)0x0) {
        iVar11 = 3;
        if (dVar2 + dVar1 <= local_38.Z) goto LAB_004270c7;
        dVar2 = this->player->viewheight;
      }
      iVar11 = 3;
      if (dVar1 + dVar2 <= local_38.Z) goto LAB_004270c7;
    }
  }
  bVar13 = (psVar9->MoreFlags & 0x60) == 0;
LAB_004270d8:
  iVar11 = this->waterlevel;
  if ((iVar11 != 0 && this->boomwaterlevel == '\0') && dosplash) {
    local_38.X = (this->__Pos).X;
    local_38.Y = (this->__Pos).Y;
    P_HitWater(this,this->Sector,&local_38,true,true,false);
    iVar11 = this->waterlevel;
  }
  this->boomwaterlevel = (BYTE)iVar11;
  if (bVar13) {
    this->waterlevel = (uint)(byte)iVar8;
  }
  return false;
}

Assistant:

bool AActor::UpdateWaterLevel (bool dosplash)
{
	BYTE lastwaterlevel = waterlevel;
	double fh = -FLT_MAX;
	bool reset=false;

	waterlevel = 0;

	if (Sector == NULL)
	{
		return false;
	}

	if (Sector->MoreFlags & SECF_UNDERWATER)	// intentionally not SECF_UNDERWATERMASK
	{
		waterlevel = 3;
	}
	else
	{
		const sector_t *hsec = Sector->GetHeightSec();
		if (hsec != NULL)
		{
			fh = hsec->floorplane.ZatPoint (this);
			//if (hsec->MoreFlags & SECF_UNDERWATERMASK)	// also check Boom-style non-swimmable sectors
			{
				if (Z() < fh)
				{
					waterlevel = 1;
					if (Center() < fh)
					{
						waterlevel = 2;
						if ((player && Z() + player->viewheight <= fh) ||
							(Top() <= fh))
						{
							waterlevel = 3;
						}
					}
				}
				else if (!(hsec->MoreFlags & SECF_FAKEFLOORONLY) && (Top() > hsec->ceilingplane.ZatPoint (this)))
				{
					waterlevel = 3;
				}
				else
				{
					waterlevel = 0;
				}
			}
			// even non-swimmable deep water must be checked here to do the splashes correctly
			// But the water level must be reset when this function returns
			if (!(hsec->MoreFlags&SECF_UNDERWATERMASK))
			{
				reset = true;
			}
		}
		else
		{
			// Check 3D floors as well!
			for(auto rover : Sector->e->XFloor.ffloors)
			{
				if (!(rover->flags & FF_EXISTS)) continue;
				if(!(rover->flags & FF_SWIMMABLE) || rover->flags & FF_SOLID) continue;

				double ff_bottom=rover->bottom.plane->ZatPoint(this);
				double ff_top=rover->top.plane->ZatPoint(this);

				if(ff_top <= Z() || ff_bottom > (Center())) continue;
				
				fh=ff_top;
				if (Z() < fh)
				{
					waterlevel = 1;
					if (Center() < fh)
					{
						waterlevel = 2;
						if ((player && Z() + player->viewheight <= fh) ||
							(Top() <= fh))
						{
							waterlevel = 3;
						}
					}
				}

				break;
			}
		}
	}
		
	// some additional checks to make deep sectors like Boom's splash without setting
	// the water flags. 
	if (boomwaterlevel == 0 && waterlevel != 0 && dosplash) 
	{
		P_HitWater(this, Sector, PosAtZ(fh), true);
	}
	boomwaterlevel = waterlevel;
	if (reset)
	{
		waterlevel = lastwaterlevel;
	}
	return false;	// we did the splash ourselves
}